

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationAPITest::getProgramInterface
          (VertexAttribLocationAPITest *this,GLuint param_1,ProgramInterface *program_interface,
          VaryingPassthrough *param_3)

{
  ShaderInterface *this_00;
  pointer puVar1;
  GLuint offset;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this_00 = &program_interface->m_vertex;
  offset = Utils::Type::GetSize((Type *)&Utils::Type::vec4);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
             (Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_goku_data,&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
             (Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_gohan_data,&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
             (Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_goten_data,&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
             (Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_chichi_data,&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  std::__cxx11::string::assign((char *)this_00);
  puVar1 = (this->m_goku_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Utils::ShaderInterface::Input<void>
            (this_00,"goku","layout (location = GOKU_LOCATION)",0,2,(Type *)&Utils::Type::vec4,'\0',
             0,0,offset * 3,puVar1,
             (long)(this->m_goku_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1);
  puVar1 = (this->m_gohan_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Utils::ShaderInterface::Input<void>
            (this_00,"gohan",glcts::fixed_sample_locations_values + 1,0,-1,
             (Type *)&Utils::Type::vec4,'\0',0,0,offset * 2,puVar1,
             (long)(this->m_gohan_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1);
  puVar1 = (this->m_goten_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Utils::ShaderInterface::Input<void>
            (this_00,"goten",glcts::fixed_sample_locations_values + 1,0,6,(Type *)&Utils::Type::vec4
             ,'\0',0,0,offset,puVar1,
             (long)(this->m_goten_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1);
  puVar1 = (this->m_chichi_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Utils::ShaderInterface::Input<void>
            (this_00,"chichi",glcts::fixed_sample_locations_values + 1,0,-1,
             (Type *)&Utils::Type::vec4,'\0',0,0,0,puVar1,
             (long)(this->m_chichi_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar1);
  return;
}

Assistant:

void VertexAttribLocationAPITest::getProgramInterface(GLuint /* test_case_index */,
													  Utils::ProgramInterface& program_interface,
													  Utils::VaryingPassthrough& /* varying_passthrough */)
{
	Utils::ShaderInterface& si		  = program_interface.GetShaderInterface(Utils::Shader::VERTEX);
	const Utils::Type&		type	  = Utils::Type::vec4;
	const GLuint			type_size = type.GetSize();

	/* Offsets */
	const GLuint chichi_offset = 0;
	const GLuint goten_offset  = chichi_offset + type_size;
	const GLuint gohan_offset  = goten_offset + type_size;
	const GLuint goku_offset   = gohan_offset + type_size;

	/* Locations */
	const GLuint goku_location  = 2;
	const GLuint goten_location = m_goten_location;

	/* Generate data */
	m_goku_data   = type.GenerateDataPacked();
	m_gohan_data  = type.GenerateDataPacked();
	m_goten_data  = type.GenerateDataPacked();
	m_chichi_data = type.GenerateDataPacked();

	/* Globals */
	si.m_globals = "const uint GOKU_LOCATION = 2;\n";

	/* Attributes */
	si.Input("goku" /* name */, "layout (location = GOKU_LOCATION)" /* qualifiers */, 0 /* expected_componenet */,
			 goku_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, goku_offset /* offset */, (GLvoid*)&m_goku_data[0] /* data */,
			 m_goku_data.size() /* data_size */);

	si.Input("gohan" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			 Utils::Variable::m_automatic_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, gohan_offset /* offset */,
			 (GLvoid*)&m_gohan_data[0] /* data */, m_gohan_data.size() /* data_size */);

	si.Input("goten" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			 goten_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, goten_offset /* offset */,
			 (GLvoid*)&m_goten_data[0] /* data */, m_goten_data.size() /* data_size */);

	si.Input("chichi" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			 Utils::Variable::m_automatic_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, chichi_offset /* offset */,
			 (GLvoid*)&m_chichi_data[0] /* data */, m_chichi_data.size() /* data_size */);
}